

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
getOptionIndex(HighsLogOptions *report_log_options,string *name,
              vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
              HighsInt *index)

{
  __type _Var1;
  size_type sVar2;
  undefined8 uVar3;
  int *in_RCX;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt num_options;
  
  sVar2 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size(in_RDX);
  *in_RCX = 0;
  while( true ) {
    if ((int)sVar2 <= *in_RCX) {
      uVar3 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"getOptionIndex: Option \"%s\" is unknown\n",uVar3);
      return kUnknownOption;
    }
    std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[](in_RDX,(long)*in_RCX);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,in_RSI);
    if (_Var1) break;
    *in_RCX = *in_RCX + 1;
  }
  return kOk;
}

Assistant:

OptionStatus getOptionIndex(const HighsLogOptions& report_log_options,
                            const std::string& name,
                            const std::vector<OptionRecord*>& option_records,
                            HighsInt& index) {
  HighsInt num_options = option_records.size();
  for (index = 0; index < num_options; index++)
    if (option_records[index]->name == name) return OptionStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getOptionIndex: Option \"%s\" is unknown\n", name.c_str());
  return OptionStatus::kUnknownOption;
}